

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::startSeparatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  int **this_00;
  long lVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this[1].hoverSeparator.d.ptr;
  QDockAreaLayoutInfo::findSeparator((QList<int> *)&local_40,(QDockAreaLayoutInfo *)this_00,pos);
  QArrayDataPointer<int>::operator=(&(this->movingSeparator).d,&local_40);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    QDockAreaLayoutInfo::operator=
              ((QDockAreaLayoutInfo *)&this[2].hoverSeparator.d.size,(QDockAreaLayoutInfo *)this_00)
    ;
    QVar2 = *pos;
    this->movingSeparatorOrigin = QVar2;
    this->movingSeparatorPos = QVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return lVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::startSeparatorMove(const QPoint &pos)
{
    movingSeparator = findSeparator(pos);

    if (movingSeparator.isEmpty())
        return false;

    layout()->savedState = layout()->layoutState;
    movingSeparatorPos = movingSeparatorOrigin = pos;

    return true;
}